

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# f77_wrap3.c
# Opt level: O1

void ftghtb_(int *A1,int *A2,int *A3,int *A4,int *A5,char *A6,int *A7,char *A8,char *A9,char *A10,
            int *A11,size_t C6,size_t C8,size_t C9,size_t C10)

{
  int iVar1;
  char **ttype;
  char *pcVar2;
  long *tbcol;
  long lVar3;
  char **tform;
  char **tunit;
  char *s;
  size_t sVar4;
  int maxfield;
  ulong uVar5;
  ulong uVar6;
  int iVar7;
  uint celem_len;
  size_t sVar9;
  long lVar10;
  uint uVar11;
  int felem_len;
  ulong uVar12;
  int local_a8;
  long B4;
  long B3;
  ulong local_80;
  ulong local_78;
  ulong local_70;
  ulong local_68;
  fitsfile *local_60;
  int *local_58;
  int *local_50;
  int *local_48;
  char *local_40;
  long tfields;
  unsigned_long uVar8;
  
  local_60 = gFitsFiles[*A1];
  uVar11 = *A2;
  lVar10 = (long)(int)uVar11;
  uVar12 = 0;
  local_58 = A5;
  ffgkyj(local_60,"TFIELDS",&tfields,(char *)0x0,A11);
  if (tfields < lVar10) {
    uVar11 = (uint)tfields;
  }
  uVar5 = tfields & 0xffffffff;
  if (-1 < lVar10) {
    uVar5 = (ulong)uVar11;
  }
  B3 = (long)*A3;
  maxfield = (int)uVar5;
  uVar6 = 1;
  if (1 < maxfield) {
    uVar6 = uVar5;
  }
  uVar8 = C6;
  if (C6 < gMinStrLen) {
    uVar8 = gMinStrLen;
  }
  B4 = (long)*A4;
  uVar11 = (int)uVar8 + 1;
  local_50 = A3;
  local_48 = A4;
  ttype = (char **)malloc(uVar6 * 8);
  pcVar2 = (char *)malloc((ulong)(uVar11 * (int)uVar6));
  *ttype = pcVar2;
  local_40 = A6;
  pcVar2 = f2cstrv2(A6,pcVar2,(int)C6,uVar11,(int)uVar6);
  do {
    ttype[uVar12] = pcVar2;
    uVar12 = uVar12 + 1;
    pcVar2 = pcVar2 + (int)uVar11;
  } while (uVar6 != uVar12);
  iVar1 = *A2;
  lVar10 = (long)iVar1;
  local_70 = (ulong)uVar11;
  local_68 = uVar6;
  tbcol = (long *)malloc(lVar10 * 8);
  if (0 < lVar10) {
    lVar3 = 0;
    do {
      tbcol[lVar3] = (long)A7[lVar3];
      lVar3 = lVar3 + 1;
    } while (lVar10 != lVar3);
  }
  uVar12 = 1;
  if (1 < maxfield) {
    uVar12 = uVar5;
  }
  felem_len = (int)C8;
  iVar7 = felem_len;
  if (C8 < gMinStrLen) {
    iVar7 = (int)gMinStrLen;
  }
  uVar11 = iVar7 + 1;
  tform = (char **)malloc(uVar12 * 8);
  iVar7 = (int)uVar12;
  pcVar2 = (char *)malloc((ulong)(uVar11 * iVar7));
  *tform = pcVar2;
  pcVar2 = f2cstrv2(A8,pcVar2,felem_len,uVar11,iVar7);
  uVar6 = 0;
  do {
    tform[uVar6] = pcVar2;
    uVar6 = uVar6 + 1;
    pcVar2 = pcVar2 + (int)uVar11;
  } while (uVar12 != uVar6);
  uVar6 = 1;
  if (1 < maxfield) {
    uVar6 = uVar5;
  }
  uVar8 = C9;
  if (C9 < gMinStrLen) {
    uVar8 = gMinStrLen;
  }
  celem_len = (int)uVar8 + 1;
  local_78 = (ulong)uVar11;
  tunit = (char **)malloc(uVar6 * 8);
  local_a8 = (int)uVar6;
  pcVar2 = (char *)malloc((ulong)(celem_len * local_a8));
  *tunit = pcVar2;
  pcVar2 = f2cstrv2(A9,pcVar2,(int)C9,celem_len,local_a8);
  uVar5 = 0;
  do {
    tunit[uVar5] = pcVar2;
    uVar5 = uVar5 + 1;
    pcVar2 = pcVar2 + (int)celem_len;
  } while (uVar12 != uVar5);
  sVar9 = gMinStrLen;
  if (gMinStrLen <= C10) {
    sVar9 = C10;
  }
  local_80 = (ulong)celem_len;
  s = (char *)malloc(sVar9 + 1);
  s[C10] = '\0';
  pcVar2 = A10;
  memcpy(s,A10,C10);
  kill_trailing(s,(char)pcVar2);
  ffghtb(local_60,maxfield,&B3,&B4,local_58,ttype,tbcol,tform,tunit,s,A11);
  *local_50 = (int)B3;
  *local_48 = (int)B4;
  c2fstrv2(*ttype,local_40,(int)local_70,(int)C6,(int)local_68);
  free(*ttype);
  free(ttype);
  if (0 < iVar1) {
    lVar3 = 0;
    do {
      A7[lVar3] = (int)tbcol[lVar3];
      lVar3 = lVar3 + 1;
    } while (lVar10 != lVar3);
  }
  free(tbcol);
  c2fstrv2(*tform,A8,(int)local_78,felem_len,iVar7);
  free(*tform);
  free(tform);
  c2fstrv2(*tunit,A9,(int)local_80,(int)C9,local_a8);
  free(*tunit);
  free(tunit);
  if (s != (char *)0x0) {
    sVar4 = strlen(s);
    if (C10 <= sVar4) {
      sVar4 = C10;
    }
    memcpy(A10,s,sVar4);
    sVar4 = strlen(s);
    if (sVar4 <= C10 && C10 - sVar4 != 0) {
      memset(A10 + sVar4,0x20,C10 - sVar4);
    }
    free(s);
  }
  return;
}

Assistant:

CFextern VOID_cfF(FTGHTB,ftghtb)
CFARGT14(NCF,DCF,ABSOFT_cf2(VOID),FITSUNIT,INT,PLONG,PLONG,PINT,PSTRINGV,LONGV,PSTRINGV,PSTRINGV,PSTRING,PINT,CF_0,CF_0,CF_0))
{
   QCF(FITSUNIT,1)
   QCF(INT,2)
   QCF(PLONG,3)
   QCF(PLONG,4)
   QCF(PINT,5)
   QCF(PSTRINGV,6)
   QCF(LONGV,7)
   QCF(PSTRINGV,8)
   QCF(PSTRINGV,9)
   QCF(PSTRING,10)
   QCF(PINT,11)

   fitsfile *fptr;
   long tfields;
   int maxdim,*status;

   fptr = TCF(ftghtb,FITSUNIT,1,0);
   status =  TCF(ftghtb,PINT,11,0);
   maxdim =  TCF(ftghtb,INT,2,0);
   ffgkyj( fptr, "TFIELDS", &tfields, 0, status );
   maxdim = (maxdim<0) ? tfields : _cfMIN(tfields,maxdim);

   ffghtb(   fptr, maxdim
             TCF(ftghtb,PLONG,3,1)
             TCF(ftghtb,PLONG,4,1)
             TCF(ftghtb,PINT,5,1)
             TCF(ftghtb,PSTRINGV,6,1)
             TCF(ftghtb,LONGV,7,1)
             TCF(ftghtb,PSTRINGV,8,1)
             TCF(ftghtb,PSTRINGV,9,1)
             TCF(ftghtb,PSTRING,10,1)
             , status );

   RCF(FITSUNIT,1)
   RCF(INT,2)
   RCF(PLONG,3)
   RCF(PLONG,4)
   RCF(PINT,5)
   RCF(PSTRINGV,6)
   RCF(LONGV,7)
   RCF(PSTRINGV,8)
   RCF(PSTRINGV,9)
   RCF(PSTRING,10)
   RCF(PINT,11)
}